

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void Z80::OpCode_Next_TEST(void)

{
  byte bVar1;
  bool in_SIL;
  int e [4];
  
  if (0 < DAT_0018a51c) {
    e[0] = 0xed;
    e[1] = 0x27;
    bVar1 = GetByteNoMem((char **)0x0,in_SIL);
    e[2] = (int)bVar1;
    e[3] = -1;
    resolveRelocationAndSmartSmc(2,HIGH);
    EmitBytes(e,true);
    return;
  }
  Error("Z80N instructions are currently disabled",bp,SUPPRESS);
  return;
}

Assistant:

static void OpCode_Next_TEST() {
		if (Options::syx.IsNextEnabled < 1) {
			Error("Z80N instructions are currently disabled", bp, SUPPRESS);
			return;
		}
		int e[] { 0xED, 0x27, GetByteNoMem(lp), -1 };
		resolveRelocationAndSmartSmc(2, Relocation::HIGH);
		EmitBytes(e, true);
	}